

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O2

ReadFileResult
anon_unknown.dwarf_5908b1::TestPresetExecutionNoTestsActionHelper
          (NoTestsActionEnum *out,Value *value)

{
  bool bVar1;
  NoTestsActionEnum NVar2;
  String local_50;
  
  NVar2 = Default;
  if (value != (Value *)0x0) {
    bVar1 = Json::Value::isString(value);
    if (!bVar1) {
      return INVALID_PRESET;
    }
    Json::Value::asString_abi_cxx11_(&local_50,value);
    bVar1 = std::operator==(&local_50,"default");
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar1) {
      Json::Value::asString_abi_cxx11_(&local_50,value);
      bVar1 = std::operator==(&local_50,"error");
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar1) {
        NVar2 = Error;
      }
      else {
        Json::Value::asString_abi_cxx11_(&local_50,value);
        bVar1 = std::operator==(&local_50,"ignore");
        std::__cxx11::string::~string((string *)&local_50);
        if (!bVar1) {
          return INVALID_PRESET;
        }
        NVar2 = Ignore;
      }
    }
  }
  *out = NVar2;
  return READ_OK;
}

Assistant:

ReadFileResult TestPresetExecutionNoTestsActionHelper(
  TestPreset::ExecutionOptions::NoTestsActionEnum& out,
  const Json::Value* value)
{
  if (!value) {
    out = TestPreset::ExecutionOptions::NoTestsActionEnum::Default;
    return ReadFileResult::READ_OK;
  }

  if (!value->isString()) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (value->asString() == "default") {
    out = TestPreset::ExecutionOptions::NoTestsActionEnum::Default;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "error") {
    out = TestPreset::ExecutionOptions::NoTestsActionEnum::Error;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "ignore") {
    out = TestPreset::ExecutionOptions::NoTestsActionEnum::Ignore;
    return ReadFileResult::READ_OK;
  }

  return ReadFileResult::INVALID_PRESET;
}